

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferFFS.cpp
# Opt level: O3

void __thiscall
adios2::format::BufferFFS::BufferFFS(BufferFFS *this,FFSBuffer Buf,void *data,size_t len)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BufferFFS","");
  Buffer::Buffer(&this->super_Buffer,&local_50,len);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__BufferFFS_008720a0;
  this->m_buffer = Buf;
  this->m_data = data;
  return;
}

Assistant:

BufferFFS::BufferFFS(FFSBuffer Buf, void *data, size_t len) : Buffer("BufferFFS", len)
{
    m_buffer = Buf;
    m_data = data;
}